

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2e402::BoidsPlugIn::handleFunctionKeys(BoidsPlugIn *this,int keyNumber)

{
  ProximityToken *pPVar1;
  long lVar2;
  ostream *poVar3;
  int max;
  int min;
  float local_34;
  int local_30;
  int local_2c;
  
  switch(keyNumber) {
  case 1:
    addBoidToFlock(this);
    return;
  case 2:
    removeBoidFromFlock(this);
    return;
  case 3:
    nextPD(this);
    return;
  case 4:
    this->constraint = this->constraint + insideSphere;
    updateObstacles(this);
    return;
  case 5:
    pPVar1 = (*(this->flock).
               super__Vector_base<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->proximityToken;
    (*pPVar1->_vptr_AbstractTokenForProximityDatabase[4])(pPVar1,&local_2c,&local_30,&local_34);
    lVar2 = std::cout;
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 2;
    *(uint *)(XSetLocaleModifiers + *(long *)(lVar2 + -0x18)) =
         *(uint *)(XSetLocaleModifiers + *(long *)(lVar2 + -0x18)) | 4;
    poVar3 = std::operator<<((ostream *)&std::cout,"Bin populations: min, max, average: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
    poVar3 = std::operator<<(poVar3," (non-empty bins)");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Boid neighbors:  min, max, average: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(float)(anonymous_namespace)::Boid::totalNeighbors /
                               (float)this->population);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void handleFunctionKeys (int keyNumber)
        {
            switch (keyNumber)
            {
            case 1:  addBoidToFlock ();         break;
            case 2:  removeBoidFromFlock ();    break;
            case 3:  nextPD ();                 break;
            case 4:  nextBoundaryCondition ();  break;
            case 5:  printLQbinStats ();        break;
            }
        }